

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O2

void poplocal(void)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *item;
  
  if (symlistlist->next != symlistlist) {
    pIVar1 = (symlistlist->next->element).itm;
    item = pIVar1->next;
    while (item != pIVar1) {
      pIVar2 = item->next;
      delete(item);
      item = pIVar2;
    }
    delete(symlistlist->next);
    return;
  }
  __assert_fail("symlistlist->next != symlistlist",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/symbol.c"
                ,0x81,"void poplocal()");
}

Assistant:

void poplocal() /* a lot of storage leakage here for symbols we are guaranteed
	not to need */
{
	List *sl;
	Item *i, *j;

	assert(symlistlist->next != symlistlist);
	sl = LST(symlistlist->next);
	for (i = sl->next; i != sl; i = j) {
		j = i->next;
		delete(i);
	}
	delete(symlistlist->next);
}